

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  VP8LBitReader *br;
  uint32_t **decoded_data_00;
  ushort uVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  VP8LImageTransformType VVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  VP8StatusCode VVar8;
  int *mapping;
  uint32_t *puVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  VP8StatusCode VVar13;
  uint uVar14;
  uint32_t uVar15;
  VP8LTransform *pVVar16;
  uint ysize_00;
  HuffmanTables *huffman_tables;
  uint uVar17;
  uint32_t *huffman_image;
  uint32_t *local_50;
  HTreeGroup *local_48;
  HuffmanTables *local_40;
  uint32_t **local_38;
  
  br = &dec->br;
  local_38 = decoded_data;
  if (is_level0 != 0) {
    uVar3 = VP8LReadBits(br,1);
joined_r0x0010f08e:
    if (uVar3 != 0) {
      do {
        iVar5 = dec->next_transform;
        VVar4 = VP8LReadBits(br,2);
        if ((dec->transforms_seen >> (VVar4 & 0x1f) & 1) != 0) goto LAB_0010f621;
        pVVar16 = dec->transforms + iVar5;
        dec->transforms_seen = dec->transforms_seen | 1 << ((byte)VVar4 & 0x1f);
        pVVar16->type = VVar4;
        pVVar16->xsize = xsize;
        pVVar16->ysize = ysize;
        decoded_data_00 = &pVVar16->data;
        pVVar16->data = (uint32_t *)0x0;
        dec->next_transform = dec->next_transform + 1;
        if (VVar4 < SUBTRACT_GREEN_TRANSFORM) {
          uVar3 = VP8LReadBits(br,3);
          bVar10 = (byte)(uVar3 + 2);
          pVVar16->bits = uVar3 + 2;
          uVar14 = ~(-1 << (bVar10 & 0x1f));
          iVar5 = DecodeImageStream(pVVar16->xsize + uVar14 >> (bVar10 & 0x1f),
                                    uVar14 + pVVar16->ysize >> (bVar10 & 0x1f),0,dec,decoded_data_00
                                   );
          if (iVar5 == 0) goto LAB_0010f621;
        }
        else if (VVar4 == COLOR_INDEXING_TRANSFORM) goto LAB_0010f175;
        uVar3 = VP8LReadBits(br,1);
        if (uVar3 == 0) break;
      } while( true );
    }
  }
  uVar14 = 1;
  uVar3 = VP8LReadBits(br,1);
  if (uVar3 == 0) {
    uVar3 = 0;
LAB_0010f2cd:
    huffman_tables = &(dec->hdr).huffman_tables;
    mapping = (int *)0x0;
    local_50 = (uint32_t *)0x0;
    local_48 = (HTreeGroup *)0x0;
    uVar7 = 1;
    if (is_level0 != 0) {
      uVar14 = 1;
      uVar7 = VP8LReadBits(br,1);
      if (uVar7 == 0) {
        mapping = (int *)0x0;
        uVar7 = 1;
        goto LAB_0010f3ec;
      }
      local_40 = huffman_tables;
      uVar7 = VP8LReadBits(br,3);
      bVar10 = (byte)(uVar7 + 2);
      iVar5 = 1 << (bVar10 & 0x1f);
      uVar14 = 1;
      uVar17 = (xsize + iVar5) - 1U >> (bVar10 & 0x1f);
      ysize_00 = (ysize + iVar5) - 1U >> (bVar10 & 0x1f);
      mapping = (int *)0x0;
      iVar5 = DecodeImageStream(uVar17,ysize_00,0,dec,&local_50);
      huffman_tables = local_40;
      if (iVar5 != 0) {
        uVar17 = uVar17 * ysize_00;
        (dec->hdr).huffman_subsample_bits = uVar7 + 2;
        if (0 < (int)uVar17) {
          uVar14 = 1;
          uVar12 = 0;
          do {
            uVar1 = *(ushort *)((long)local_50 + uVar12 * 4 + 1);
            local_50[uVar12] = (uint)uVar1;
            if (uVar14 <= uVar1) {
              uVar14 = uVar1 + 1;
            }
            uVar12 = uVar12 + 1;
          } while (uVar17 != uVar12);
        }
        if ((uVar14 < 0x3e9) && ((int)uVar14 <= xsize * ysize)) {
          mapping = (int *)0x0;
          uVar7 = uVar14;
        }
        else {
          mapping = (int *)WebPSafeMalloc((ulong)uVar14,4);
          if (mapping == (int *)0x0) {
            if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
              dec->status = VP8_STATUS_OUT_OF_MEMORY;
            }
            mapping = (int *)0x0;
            goto LAB_0010f5f8;
          }
          memset(mapping,0xff,(ulong)uVar14 << 2);
          if ((int)uVar17 < 1) {
            uVar7 = 0;
          }
          else {
            uVar12 = 0;
            uVar7 = 0;
            do {
              uVar15 = mapping[local_50[uVar12]];
              if (mapping[local_50[uVar12]] == 0xffffffff) {
                mapping[local_50[uVar12]] = uVar7;
                uVar15 = uVar7;
                uVar7 = uVar7 + 1;
              }
              local_50[uVar12] = uVar15;
              uVar12 = uVar12 + 1;
            } while (uVar17 != uVar12);
          }
        }
        goto LAB_0010f3ec;
      }
LAB_0010f5f8:
      WebPSafeFree(mapping);
      WebPSafeFree(local_50);
      VP8LHuffmanTablesDeallocate(huffman_tables);
      VP8LHtreeGroupsFree(local_48);
      goto LAB_0010f621;
    }
LAB_0010f3ec:
    if (((dec->br).eos != 0) ||
       (iVar5 = ReadHuffmanCodesHelper(uVar3,uVar7,uVar14,mapping,dec,huffman_tables,&local_48),
       iVar5 == 0)) goto LAB_0010f5f8;
    (dec->hdr).huffman_image = local_50;
    (dec->hdr).num_htree_groups = uVar7;
    (dec->hdr).htree_groups = local_48;
    WebPSafeFree(mapping);
    if (0 < (int)uVar3) {
      VVar13 = VP8_STATUS_OUT_OF_MEMORY;
      (dec->hdr).color_cache_size = 1 << ((byte)uVar3 & 0x1f);
      iVar5 = VP8LColorCacheInit(&(dec->hdr).color_cache,uVar3);
      if (iVar5 != 0) goto LAB_0010f51a;
      VVar8 = dec->status;
      goto LAB_0010f629;
    }
    (dec->hdr).color_cache_size = 0;
LAB_0010f51a:
    iVar5 = (dec->hdr).huffman_subsample_bits;
    bVar10 = (byte)iVar5;
    dec->width = xsize;
    dec->height = ysize;
    (dec->hdr).huffman_xsize = ((1 << (bVar10 & 0x1f)) + xsize) - 1U >> (bVar10 & 0x1f);
    (dec->hdr).huffman_mask = -(uint)(iVar5 == 0) | ~(-1 << (bVar10 & 0x1f));
    if (is_level0 != 0) {
      dec->state = READ_HDR;
      puVar9 = (uint32_t *)0x0;
LAB_0010f572:
      if (local_38 != (uint32_t **)0x0) {
        *local_38 = puVar9;
      }
      dec->last_pixel = 0;
      iVar5 = 1;
      if (is_level0 != 0) {
        return 1;
      }
      goto LAB_0010f641;
    }
    puVar9 = (uint32_t *)WebPSafeMalloc((long)ysize * (long)xsize,4);
    if (puVar9 == (uint32_t *)0x0) {
      VVar8 = dec->status;
      VVar13 = VP8_STATUS_OUT_OF_MEMORY;
      goto LAB_0010f629;
    }
    iVar5 = DecodeImageData(dec,puVar9,xsize,ysize,ysize,(ProcessRowsFunc)0x0);
    if ((iVar5 != 0) && ((dec->br).eos == 0)) goto LAB_0010f572;
  }
  else {
    uVar3 = VP8LReadBits(br,4);
    if (uVar3 - 1 < 0xb) goto LAB_0010f2cd;
LAB_0010f621:
    VVar8 = dec->status;
LAB_0010f624:
    VVar13 = VP8_STATUS_BITSTREAM_ERROR;
LAB_0010f629:
    if ((VVar8 == VP8_STATUS_OK) || (VVar8 == VP8_STATUS_SUSPENDED)) {
LAB_0010f632:
      dec->status = VVar13;
    }
    puVar9 = (uint32_t *)0x0;
  }
  WebPSafeFree(puVar9);
  iVar5 = 0;
LAB_0010f641:
  ClearMetadata(&dec->hdr);
  return iVar5;
LAB_0010f175:
  uVar3 = VP8LReadBits(br,8);
  iVar5 = uVar3 + 1;
  uVar14 = 0;
  if ((iVar5 < 0x11) && (uVar14 = 1, iVar5 < 5)) {
    uVar14 = 2 < iVar5 ^ 3;
  }
  xsize = (pVVar16->xsize + (1 << (sbyte)uVar14)) - 1U >> (sbyte)uVar14;
  pVVar16->bits = uVar14;
  iVar6 = DecodeImageStream(iVar5,1,0,dec,decoded_data_00);
  if (iVar6 == 0) goto LAB_0010f621;
  bVar10 = (byte)(8L >> ((byte)pVVar16->bits & 0x3f));
  puVar9 = (uint32_t *)WebPSafeMalloc(1L << (bVar10 & 0x3f),4);
  if (puVar9 == (uint32_t *)0x0) {
    VVar8 = dec->status;
    VVar13 = VP8_STATUS_OUT_OF_MEMORY;
    if ((VVar8 == VP8_STATUS_OK) || (VVar8 == VP8_STATUS_SUSPENDED)) goto LAB_0010f632;
    goto LAB_0010f624;
  }
  puVar2 = *decoded_data_00;
  *puVar9 = *puVar2;
  uVar12 = 4;
  if (1 < iVar5) {
    uVar12 = (ulong)(uint)(iVar5 * 4);
    if (iVar5 * 4 < 6) {
      uVar12 = 5;
    }
    uVar11 = 4;
    do {
      *(char *)((long)puVar9 + uVar11) =
           *(char *)((long)puVar9 + (uVar11 - 4)) + *(char *)((long)puVar2 + uVar11);
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  uVar14 = 4 << (bVar10 & 0x1f);
  if ((uint)uVar12 < uVar14) {
    memset((void *)((long)puVar9 + uVar12),0,(ulong)(uVar14 + ~(uint)uVar12) + 1);
  }
  WebPSafeFree(*decoded_data_00);
  *decoded_data_00 = puVar9;
  uVar3 = VP8LReadBits(br,1);
  goto joined_r0x0010f08e;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br;
  VP8LMetadata* const hdr = &dec->hdr;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache, color_cache_bits)) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  } else {
    hdr->color_cache_size = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}